

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

int __thiscall rcg::Stream::close(Stream *this,int __fd)

{
  int extraout_EAX;
  lock_guard<std::recursive_mutex> lock;
  Stream *in_stack_000000c0;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffff60;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((0 < this->n_open) && (this->n_open = this->n_open + -1, this->n_open == 0)) {
    stopStreaming(in_stack_000000c0);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x120524);
  return extraout_EAX;
}

Assistant:

void Stream::close()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      try
      {
        stopStreaming();
      }
      catch (...)
      {
        gentl->DSClose(stream);
        stream=0;

        buffer.setNodemap(0, "");

        nodemap=0;
        cport=0;

        throw;
      }
    }
  }
}